

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

string * __thiscall
(anonymous_namespace)::InvalidInputSource::getName_abi_cxx11_(InvalidInputSource *this)

{
  int iVar1;
  allocator<char> local_11;
  InvalidInputSource *local_10;
  InvalidInputSource *this_local;
  
  if (getName[abi:cxx11]()::name_abi_cxx11_ == '\0') {
    local_10 = this;
    iVar1 = __cxa_guard_acquire(&getName[abi:cxx11]()::name_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&getName[abi:cxx11]()::name_abi_cxx11_,"closed input source",&local_11);
      std::allocator<char>::~allocator(&local_11);
      __cxa_atexit(std::__cxx11::string::~string,&getName[abi:cxx11]()::name_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getName[abi:cxx11]()::name_abi_cxx11_);
    }
  }
  return &getName[abi:cxx11]()::name_abi_cxx11_;
}

Assistant:

std::string const&
        getName() const override
        {
            static std::string name("closed input source");
            return name;
        }